

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O0

int __thiscall Jzon::Node::toInt(Node *this,int def)

{
  Data *pDVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int local_1ac;
  stringstream local_1a8 [4];
  int val;
  stringstream sstr;
  int def_local;
  Node *this_local;
  
  bVar2 = isNumber(this);
  this_local._4_4_ = def;
  if (bVar2) {
    pDVar1 = this->data;
    _Var3 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_1a8,(string *)&pDVar1->valueStr,_Var3);
    std::istream::operator>>(local_1a8,&local_1ac);
    this_local._4_4_ = local_1ac;
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return this_local._4_4_;
}

Assistant:

int Node::toInt(int def) const { GET_NUMBER(int) }